

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_powertrain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  ChStreamOutAscii *pCVar6;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  shared_ptr<chrono::ChFunction_Recorder> mTw;
  double local_8d8;
  shared_ptr<chrono::ChShaftsThermalEngine> my_motor;
  shared_ptr<chrono::ChFunction_Recorder> mK;
  shared_ptr<chrono::ChShaft> my_shaftD;
  shared_ptr<chrono::ChShaftsTorqueConverter> my_torqueconverter;
  shared_ptr<chrono::ChShaft> my_shaftC;
  shared_ptr<chrono::ChShaft> my_shaftB;
  shared_ptr<chrono::ChFunction_Recorder> mT;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_860 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_850;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_840;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_830 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_828;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_820;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_810;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_800 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7f8;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7f0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7e0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7d0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7c0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7b0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_7a0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_790 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_788;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_780;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_770;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_760 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_758;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_750;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_740;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_730;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_720;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_710;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_700;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_6f0;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_6e0;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_6d0;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_6c0;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_6b0;
  ChSystemNSC sys;
  ChStreamOutAscii local_698 [888];
  shared_ptr<chrono::ChShaft> my_shaftA;
  ChStreamOutAscii local_50 [32];
  
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar6,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6," Example 5: torque converter and thermal engine \n");
  chrono::ChSystemNSC::ChSystemNSC(&sys,true);
  std::make_shared<chrono::ChShaft>();
  chrono::ChShaft::SetInertia(1.5);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6f0,&my_shaftA.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_6f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6f0._M_refcount);
  std::make_shared<chrono::ChShaft>();
  chrono::ChShaft::SetInertia(3.2);
  *(undefined8 *)
   (my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) =
       0xc014000000000000;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_700,&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_700);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_700._M_refcount);
  std::make_shared<chrono::ChShaft>();
  my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x10c] =
       (element_type)0x1;
  my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0xd4] =
       (element_type)0x1;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_710,&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_710);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_710._M_refcount);
  std::make_shared<chrono::ChShaft>();
  my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x10c] =
       (element_type)0x1;
  my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0xd4] =
       (element_type)0x1;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_720,&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_720);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_720._M_refcount);
  std::make_shared<chrono::ChShaftsTorqueConverter>();
  peVar4 = my_torqueconverter.
           super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_730,&my_shaftA.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_740,&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_750,&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChShaftsTorqueConverter::Initialize(peVar4,&local_730,&local_740,&local_750);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_750._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_740._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_730._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaftsTorqueConverter,void>
            (local_760,
             &my_torqueconverter.
              super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_758);
  std::make_shared<chrono::ChFunction_Recorder>();
  chrono::ChFunction_Recorder::AddPoint(0.0,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.25,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.5,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.75,16.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.9,18.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(1.0,35.0,1.0);
  p_Var7 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
           (my_torqueconverter.
            super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0xa0);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction_Recorder,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_6b0,
             &mK.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var7,&local_6b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6b0._M_refcount);
  std::make_shared<chrono::ChFunction_Recorder>();
  chrono::ChFunction_Recorder::AddPoint(0.0,2.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.25,1.8,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.5,1.5,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.75,1.15,1.0);
  chrono::ChFunction_Recorder::AddPoint(1.0,1.0,1.0);
  p_Var7 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
           (my_torqueconverter.
            super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0xb0);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction_Recorder,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_6c0,
             &mT.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var7,&local_6c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6c0._M_refcount);
  std::make_shared<chrono::ChShaftsThermalEngine>();
  peVar2 = my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_770,&my_shaftA.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_780,&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x1e8))(peVar2,&local_770,&local_780);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_780._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_770._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaftsThermalEngine,void>
            (local_790,
             &my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
            );
  chrono::ChSystem::Add(&sys,local_790);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_788);
  std::make_shared<chrono::ChFunction_Recorder>();
  chrono::ChFunction_Recorder::AddPoint(-5.0,30.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.0,30.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(200.0,60.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(400.0,40.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(450.0,0.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(500.0,-60.0,1.0);
  p_Var7 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
           (my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr + 0x90);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction_Recorder,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_6d0,
             &mTw.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var7,&local_6d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6d0._M_refcount);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n\nHere\'s the system hierarchy: \n\n ");
  iVar5 = chrono::GetLog();
  chrono::ChAssembly::ShowHierarchy(local_698,iVar5);
  local_8d8 = 0.0;
  while (local_8d8 < 4.5) {
    local_8d8 = local_8d8 + 0.01;
    chrono::ChSystem::DoFrameDynamics(local_8d8);
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"Time: ");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_8d8);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft A rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftA.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftA.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftA.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft B rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftB.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftB.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftB.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T.Convert.:");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  R=");
    dVar9 = (double)chrono::ChShaftsTorqueConverter::GetSpeedRatio();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tin=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_torqueconverter.
                                 super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tout=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_torqueconverter.
                                 super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tstator=");
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         *(ulong *)(my_torqueconverter.
                    super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0x98);
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar10,auVar8);
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,auVar8._0_8_ -
                               *(double *)
                                (my_torqueconverter.
                                 super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T.Motor: ");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T(w)=");
    dVar9 = (double)(**(code **)(*(long *)my_motor.
                                          super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"[Nm]");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  w=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (*(long *)(my_motor.
                                           super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + 0x78) + 0x90) -
                               *(double *)
                                (*(long *)(my_motor.
                                           super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + 0x80) + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"[rad/s]");
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mTw.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mT.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mK.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_torqueconverter.
              super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftA.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  chrono::ChSystem::~ChSystem((ChSystem *)&sys);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar6," Example 6: a ratcheting freewheel, as a one-directional clutch \n");
  chrono::ChSystemNSC::ChSystemNSC(&sys,true);
  std::make_shared<chrono::ChShaft>();
  my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x10c] =
       (element_type)0x1;
  my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0xd4] =
       (element_type)0x1;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7a0,&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_7a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7a0._M_refcount);
  std::make_shared<chrono::ChShaft>();
  chrono::ChShaft::SetInertia(1.5);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7b0,&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_7b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7b0._M_refcount);
  std::make_shared<chrono::ChShaft>();
  chrono::ChShaft::SetInertia(3.2);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7c0,&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::AddShaft(&sys,&local_7c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7c0._M_refcount);
  std::make_shared<chrono::ChShaft>();
  my_torqueconverter.super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[0x10c] = (element_type)0x1;
  my_torqueconverter.super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr[0xd4] = (element_type)0x1;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7d0,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&my_torqueconverter);
  chrono::ChSystem::AddShaft(&sys,&local_7d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7d0._M_refcount);
  std::make_shared<chrono::ChShaftsMotorAngle>();
  peVar3 = mK.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7e0,&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7f0,&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar3 + 0x1e8))(peVar3,&local_7e0,&local_7f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7f0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7e0._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaftsMotorAngle,void>
            (local_800,(__shared_ptr<chrono::ChShaftsMotorAngle,_(__gnu_cxx::_Lock_policy)2> *)&mK);
  chrono::ChSystem::Add(&sys,local_800);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7f8);
  mTw.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  my_shaftA.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3ff3333333333333;
  my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&DAT_3fc43bf41242d434;
  std::make_shared<chrono::ChFunction_Sine,int,double,double>
            ((int *)&mT,(double *)&mTw,(double *)&my_shaftA);
  p_Var7 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
           (mK.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x88);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction_Sine,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_6e0,
             (__shared_ptr<chrono::ChFunction_Sine,_(__gnu_cxx::_Lock_policy)2> *)&mT);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var7,&local_6e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6e0._M_refcount);
  std::make_shared<chrono::ChShaftsFreewheel>();
  peVar2 = my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_810,&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_820,&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar2 + 0x1e8))(peVar2,&local_810,&local_820);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_820._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_810._M_refcount);
  *(undefined8 *)
   (my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
   0x88) = 0x3fd015bf9217271a;
  my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [0x150] = (element_type)0x0;
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaftsFreewheel,void>
            (local_830,
             (__shared_ptr<chrono::ChShaftsFreewheel,_(__gnu_cxx::_Lock_policy)2> *)&my_motor);
  chrono::ChSystem::Add(&sys,local_830);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_828);
  std::make_shared<chrono::ChShaftsClutch>();
  plVar1 = (long *)CONCAT44(mTw.
                            super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._4_4_,
                            mTw.
                            super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._0_4_);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_840,&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_850,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&my_torqueconverter);
  (**(code **)(*plVar1 + 0x1e8))(plVar1,&local_840,&local_850);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_850._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_840._M_refcount);
  chrono::ChShaftsClutch::SetTorqueLimit
            ((ChShaftsClutch *)
             CONCAT44(mTw.
                      super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._4_4_,
                      mTw.
                      super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_4_),100.0);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChShaftsClutch,void>
            (local_860,(__shared_ptr<chrono::ChShaftsClutch,_(__gnu_cxx::_Lock_policy)2> *)&mTw);
  chrono::ChSystem::Add(&sys,local_860);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_858);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n\nHere\'s the system hierarchy: \n\n ");
  iVar5 = chrono::GetLog();
  chrono::ChAssembly::ShowHierarchy(local_698,iVar5);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)&my_shaftA,"test_clutch.txt",0x20);
  local_8d8 = 0.0;
  while (local_8d8 < 5.5) {
    chrono::ChSystem::DoStepDynamics(0.01);
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"Time: ");
    local_8d8 = local_8d8 + 0.01;
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_8d8);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft B rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftC.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftC.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftC.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft C rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftD.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftD.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftD.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Torque: Tmotor=");
    dVar9 = (double)(**(code **)(*(long *)mK.
                                          super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tfreewheel=");
    dVar9 = (double)(**(code **)(*(long *)my_motor.
                                          super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tclutch=");
    dVar9 = (double)(**(code **)(*(long *)CONCAT44(mTw.
                                                  super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  mTw.
                                                  super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  ratchet vane=");
    dVar9 = chrono::ChShaftsFreewheel::GetCurrentTeethVane
                      ((ChShaftsFreewheel *)
                       my_motor.
                       super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_50,local_8d8);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftC.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftD.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)
                                (my_shaftD.
                                 super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    dVar9 = (double)(**(code **)(*(long *)CONCAT44(mTw.
                                                  super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  mTw.
                                                  super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    dVar9 = chrono::ChShaftsFreewheel::GetCurrentTeethVane
                      ((ChShaftsFreewheel *)
                       my_motor.
                       super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar9);
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  }
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)&my_shaftA);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mTw.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_motor.super___shared_ptr<chrono::ChShaftsThermalEngine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mT.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mK.super___shared_ptr<chrono::ChFunction_Recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_torqueconverter.
              super___shared_ptr<chrono::ChShaftsTorqueConverter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftD.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftC.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_shaftB.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  chrono::ChSystem::~ChSystem((ChSystem *)&sys);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    if (false) {
        //
        // EXAMPLE 1:
        //

        GetLog() << " Example: create a simple power train with ChShaft objects: \n";

        // We will model a very basic powertrain with two shafts A and B,
        // connected by a reducer [ t ] with transmission ratio 't'. Shafts are
        // free to rotate, shaft A has an applied torque Ta, so A and B will
        // constantly accelerate. Each shaft must have some inertia, it's like a
        // flywheel, marked as || in the following scheme:
        //
        //       A           B
        //  Ta  ||---[ t ]---||
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create a 1-degree-of-freedom '1D' mechanical object, that
        // is a ChShaft (an item that can oly rotate, with one inertia value
        // and maybe one applied torque). The ChShaft objects do not have
        // any meaning in 3d: they are just 'building blocks' for making
        // power trains as in imput-output black box schemes.
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(10);
        my_shaftA->SetAppliedTorque(6);
        sys.AddShaft(my_shaftA);

        // Create another shaft. Note that we use shared pointers for ChShaft
        // objects, as we did for ChBody objects. Also, note that we must add them
        // to the ChSystemNSC.
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(100);
        my_shaftB->SetShaftFixed(false);
        sys.AddShaft(my_shaftB);

        // Create a ChShaftsGear, that represents a simplified model
        // of a reducer, with transmission ratio t, between two ChShaft objects.
        // (Note that you could also build a 3D powertrain by creating full rigid bodies
        // of ChBody type and join them using ChLinkLockRevolute, ChLinkGear 3D constraints,
        // but this would introduce many unnecessary degrees of freedom/constraints
        // whereas the 1D items of ChShaft type, in this example, make things much simplier).
        auto my_shaft_gearAB = chrono_types::make_shared<ChShaftsGear>();
        my_shaft_gearAB->Initialize(my_shaftA, my_shaftB);
        my_shaft_gearAB->SetTransmissionRatio(-0.1);  // ex., a couple of spur gears with 20 and 200 teeth
        sys.Add(my_shaft_gearAB);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 2.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..

            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  AB gear, torque on A side: " << my_shaft_gearAB->GetTorqueReactionOn1()
                     << "  AB gear, torque on B side: " << my_shaft_gearAB->GetTorqueReactionOn2() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 2:
        //

        GetLog() << " Example: a clutch between two shafts \n";

        // We will model a very basic powertrain with two shafts A and B,
        // connected by a clutch [ c ]. Shafts (see flywheels || in scheme)
        // starts with nonzero speed, and are free to rotate independently
        // until the clutch is activated: since activation, they will decelerate
        // until they have the same speed.
        //
        //       A           B
        //  Ta  ||---[ c ]---||
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create a ChShaft that starts with nonzero angular velocity
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(0.5);
        my_shaftA->SetPos_dt(30);
        sys.AddShaft(my_shaftA);

        // Create another ChShaft, with opposite initial angular velocity
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(0.6);
        my_shaftB->SetPos_dt(-10);
        sys.AddShaft(my_shaftB);

        // Create a ChShaftsClutch, that represents a simplified model
        // of a clutch between two ChShaft objects (something that limits
        // the max transmitted torque, up to slippage).
        auto my_shaft_clutchAB = chrono_types::make_shared<ChShaftsClutch>();
        my_shaft_clutchAB->Initialize(my_shaftA, my_shaftB);
        my_shaft_clutchAB->SetTorqueLimit(60);
        sys.Add(my_shaft_clutchAB);

        // Let's begin the simulation with the clutch disengaged:
        my_shaft_clutchAB->SetModulation(0);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 1.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Activate the clutch only after 0.8 seconds of simulation:
            if (chronoTime > 0.8) {
                my_shaft_clutchAB->SetModulation(1);
            }

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  AB clutch, torque on A side: " << my_shaft_clutchAB->GetTorqueReactionOn1()
                     << "  AB clutch, torque on B side: " << my_shaft_clutchAB->GetTorqueReactionOn2() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 3:
        //

        GetLog() << " Example: an epicycloidal reducer \n";

        // We will model an epicycloidal reducer using the ChShaftsPlanetary
        // constraint.
        // The ChShaftsPlanetary makes a kinematic constraint between three
        // shafts: so one of them will be 'fixed' and will represent the truss
        // of the reducer -in s reducer, this is the role of the
        // large gear with inner teeth- and the two remaining shafts are the
        // input and output shafts (in other cases, such as the differential
        // planetary gear of the cars, all three shafts are free).
        // Also, a brake is applied for the output shaft: the ChShaftsClutch
        // will be used to this end, it's enough that one of the two shafts is fixed.
        // In the following scheme, the brake is [ b ], the planetary (the
        // reducer) is [ p ], the shafts are A,B,C,D applied torque is Ta, inertias
        // of free shafts are shown as flywheels || , and fixed shafts are marked with * .
        //
        //       A           B            D
        //  Ta  ||---[ p ]---||---[ b ]---*
        //           [   ]---*
        //                   C

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create shaft A, with applied torque
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(0.5);
        my_shaftA->SetAppliedTorque(10);
        sys.AddShaft(my_shaftA);

        // Create shaft B
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(0.5);
        sys.AddShaft(my_shaftB);

        // Create shaft C, that will be fixed (to be used as truss of epicycloidal reducer)
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create a ChShaftsPlanetary, that represents a simplified model
        // of a planetary gear between THREE ChShaft objects (ex.: a car differential)
        // An epicycloidal reducer is a special type of planetary gear.
        auto my_shaft_planetaryBAC = chrono_types::make_shared<ChShaftsPlanetary>();
        my_shaft_planetaryBAC->Initialize(my_shaftB, my_shaftA, my_shaftC);  // output, carrier, fixed
        // We can set the ratios of the planetary using a simplified formula, for the
        // so called 'Willis' case. Imagine we hold fixed the carrier (shaft B in epic. reducers),
        // and leave free the truss C (the outer gear with inner teeth in our reducer); which is
        // the transmission ratio t0 that we get? It is simply t0=-Za/Zc, with Z = num of teeth of gears.
        // So just use the following to set all the three ratios automatically:
        double t0 =
            -50.0 / 100.0;  // suppose, in the reducer, that pinion A has 50 teeth and truss has 100 inner teeth.
        my_shaft_planetaryBAC->SetTransmissionRatioOrdinary(t0);
        sys.Add(my_shaft_planetaryBAC);

        // Now, let's make a shaft D, that is fixed, and used for the right side
        // of a clutch (so the clutch will act as a brake).
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.Add(my_shaftD);

        // Make the brake. It is, in fact a clutch between shafts B and D, where
        // D is fixed as a truss, so the clutch will operate as a brake.
        auto my_shaft_clutchBD = chrono_types::make_shared<ChShaftsClutch>();
        my_shaft_clutchBD->Initialize(my_shaftB, my_shaftD);
        my_shaft_clutchBD->SetTorqueLimit(60);
        sys.Add(my_shaft_clutchBD);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 1.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  epicycloidal react torques on shafts - on A: "
                     << my_shaft_planetaryBAC->GetTorqueReactionOn2()
                     << " ,   on B: " << my_shaft_planetaryBAC->GetTorqueReactionOn1()
                     << " ,   on C: " << my_shaft_planetaryBAC->GetTorqueReactionOn3() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 4:
        //

        GetLog() << " Example: constraint between a ChBody and a ChShaft \n";

        // Suppose you want to create a 3D model, for instance a slider-crank,
        // built with multiple ChBody objects; moreover you want to create a
        // powertrain, for instance a motor, a clutch, etc, for the rotation of
        // the crank. How to connect the '1D items' of ChShaft class to the 3D
        // items of ChBody class? The solution is to use the ChShaftsBody constraint,
        // shown as [ bs ] in the following scheme, where the 3D body is shown as <>.
        // In this example we also add a 'torsional spring damper' C, shown as [ t ]
        // that connects shafts A and C (C is shown as * because fixed).
        //
        //        B             A           C
        //  Ta   <>---[ bs ]---||---[ t ]---*
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(9);
        sys.AddShaft(my_shaftA);

        // Create 'C', a 1D shaft, fixed
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create 'B', a 3D rigid body
        auto my_bodyB = chrono_types::make_shared<ChBody>();
        my_bodyB->Accumulate_torque(ChVector<>(0, 0, 3), true);  // set some constant torque to body
        sys.Add(my_bodyB);

        // Make the torsional spring-damper between shafts A and C.
        auto my_shaft_torsionAC = chrono_types::make_shared<ChShaftsTorsionSpring>();
        my_shaft_torsionAC->Initialize(my_shaftA, my_shaftC);
        my_shaft_torsionAC->SetTorsionalStiffness(40);
        my_shaft_torsionAC->SetTorsionalDamping(0);
        sys.Add(my_shaft_torsionAC);

        // Make the shaft 'A' connected to the rotation of the 3D body 'B'.
        // We must specify the direction (in body coordinates) along which the
        // shaft will affect the body.
        auto my_shaftbody_connection = chrono_types::make_shared<ChShaftsBody>();
        ChVector<> mshaftdir(VECT_Z);
        my_shaftbody_connection->Initialize(my_shaftA, my_bodyB, mshaftdir);
        sys.Add(my_shaftbody_connection);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 0.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  Body B angular speed on z: " << my_bodyB->GetWvel_loc().z()
                     << "  accel on z: " << my_bodyB->GetWacc_loc().z() << "\n"
                     << "  AC spring, torque on A side: " << my_shaft_torsionAC->GetTorqueReactionOn1()
                     << "  torque on C side: " << my_shaft_torsionAC->GetTorqueReactionOn2() << "\n"
                     << "  shafts/body reaction,  on shaft A: " << my_shaftbody_connection->GetTorqueReactionOnShaft()
                     << " ,   on body (x y z): " << my_shaftbody_connection->GetTorqueReactionOnBody().x() << " "
                     << my_shaftbody_connection->GetTorqueReactionOnBody().y() << " "
                     << my_shaftbody_connection->GetTorqueReactionOnBody().z() << " "
                     << "\n";
        }
    }

    if (true) {
        //
        // EXAMPLE 5:
        //

        GetLog() << " Example 5: torque converter and thermal engine \n";

        // In this example we use a torque converter.
        // The torque converter is represented by a ChShaftsTorqueConverter
        // object, that connects three '1D items' of ChShaft class:
        // - the input shaft A, ie. the impeller connected to the engine
        // - the output shaft B, i.e. the turbine connected to the gears and wheels
        // - the stator C, that does not rotate and transmits reaction to the truss.
        // In the following scheme, the torque converter is represented as [ tc ],
        // and we also add a thermal engine, shown with [ e ], and a breaking torque Tb
        // (C is shown as * because fixed).
        //
        //   D           A             B
        //   *---[ e ]---||---[ tc ]---||  Tb
        //                    [    ]---*
        //                             C
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(1.5);
        sys.AddShaft(my_shaftA);

        // Create 'B', a 1D shaft
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(3.2);
        my_shaftB->SetAppliedTorque(-5);  // apply const braking torque
        sys.AddShaft(my_shaftB);

        // Create 'C', a 1D shaft, fixed
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create 'D', a 1D shaft, fixed
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.AddShaft(my_shaftD);

        // Make the torque converter and connect the shafts:
        // A (input),B (output), C(truss stator)
        auto my_torqueconverter = chrono_types::make_shared<ChShaftsTorqueConverter>();
        my_torqueconverter->Initialize(my_shaftA, my_shaftB, my_shaftC);
        sys.Add(my_torqueconverter);

        auto mK = chrono_types::make_shared<ChFunction_Recorder>();
        mK->AddPoint(0.0, 15);
        mK->AddPoint(0.25, 15);
        mK->AddPoint(0.50, 15);
        mK->AddPoint(0.75, 16);
        mK->AddPoint(0.90, 18);
        mK->AddPoint(1.00, 35);
        my_torqueconverter->SetCurveCapacityFactor(mK);

        auto mT = chrono_types::make_shared<ChFunction_Recorder>();
        mT->AddPoint(0.0, 2.00);
        mT->AddPoint(0.25, 1.80);
        mT->AddPoint(0.50, 1.50);
        mT->AddPoint(0.75, 1.15);
        mT->AddPoint(1.00, 1.00);
        my_torqueconverter->SetCurveTorqueRatio(mT);

        // Make the thermal engine, acting on shaft A, the input to
        // the torque converter. Note that the thermal engine also
        // requires another shaft D, that is used to transmit the
        // reaction torque back to a truss (the motor block).

        // Option A: use a ChShaftsMotor, in the MOT_MODE_TORQUE mode.
        //  It works, but most often this is more useful when in MOT_MODE_SPEED.
        /*
        auto my_motor = chrono_types::make_shared<ChShaftsMotor>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        my_motor->SetMotorMode(ChShaftsMotor::MOT_MODE_TORQUE);
        my_motor->SetMotorTorque(30);
        sys.Add(my_motor);
        */

        // Option B: use a ChShaftsTorque, it just applies a torque
        // to my_shaftA (say, the crankshaft) and the negative torque
        // to my_shaftD (say, the motor block).
        // It is a quick approach. But you should take care of changing
        // the torque at each timestep if you want to simulate a torque curve...
        /*
        auto my_motor = chrono_types::make_shared<ChShaftsTorque>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        my_motor->SetTorque(30);
        sys.Add(my_motor);
        */

        // Option C: a more powerful approach where you can
        // define a torque curve and a throttle value, using the
        // ChShaftsThermalEngine.

        auto my_motor = chrono_types::make_shared<ChShaftsThermalEngine>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        sys.Add(my_motor);

        auto mTw = chrono_types::make_shared<ChFunction_Recorder>();
        mTw->AddPoint(-5, 30);  //   [rad/s],  [Nm]
        mTw->AddPoint(0, 30);
        mTw->AddPoint(200, 60);
        mTw->AddPoint(400, 40);
        mTw->AddPoint(450, 0);
        mTw->AddPoint(500, -60);  // torque curve must be defined beyond max speed too - engine might be 'pulled'
        my_motor->SetTorqueCurve(mTw);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 4.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  T.Convert.:"
                     << "  R=" << my_torqueconverter->GetSpeedRatio()
                     << "  Tin=" << my_torqueconverter->GetTorqueReactionOnInput()
                     << "  Tout=" << my_torqueconverter->GetTorqueReactionOnOutput()
                     << "  Tstator=" << my_torqueconverter->GetTorqueReactionOnStator() << "\n"
                     << "  T.Motor: "
                     << "  T(w)=" << my_motor->GetTorqueReactionOn1() << "[Nm]"
                     << "  w=" << my_motor->GetRelativeRotation_dt() << "[rad/s]"
                     << "\n";
        }
    }

    if (true) {
        //
        // EXAMPLE 6:
        //

        GetLog() << " Example 6: a ratcheting freewheel, as a one-directional clutch \n";

        // In this example we use a ratcheting freewheel, that acts as a one-directional 
        // clutch (where the locking in reverse direction happens only at discrete
        // steps, depending on the n.of ratcheting teeths).
        // The example consists of:
        // - the fixed shaft A
        // - the shaft B, that rotates back and forth 
        // - the shaft C, that rotates only unidirectionally
        // - the fixed shaft D
        // In the following scheme
        // - the freewheel is represented as [ fw ],
        // - we also add a motor, shown with [ m ], to generate sinusoidal rotation of B for testing
        // - we also add a clutch, shown with [ cl ], just to keep the shaft C "stopped" when not 
        //   pushed by the unidirectional freewheel, otherwise would proceed in one direction forever.
        // (A,D are shown as * because fixed).
        //
        //   A           B             C             D
        //   *---[ m ]---||---[ fw ]---||---[ cl ]---*
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft, fixed
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetShaftFixed(true);
        sys.AddShaft(my_shaftA);

        // Create 'B', a 1D shaft
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(1.5);
        sys.AddShaft(my_shaftB);

        // Create 'C', a 1D shaft
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetInertia(3.2);
        sys.AddShaft(my_shaftC);

        // Create D', a 1D shaft, fixed
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.AddShaft(my_shaftD);

        // Make the motor imposing a test sinusoidal rotation
        auto my_motor = chrono_types::make_shared<ChShaftsMotorAngle>();
        my_motor->Initialize(my_shaftA, my_shaftB);
        sys.Add(my_motor);
        auto my_sinefunction = chrono_types::make_shared<ChFunction_Sine>(0, 1.2,  0.001+0.5*CH_C_2PI / 20); // phase freq ampl
        my_motor->SetAngleFunction(my_sinefunction);

        // Make the freewheel:
        auto my_freewheel = chrono_types::make_shared<ChShaftsFreewheel>();
        my_freewheel->Initialize(my_shaftB, my_shaftC);
        my_freewheel->SetRatchetingModeTeeth(25);  
        //my_freewheel->SetJammingMode(); // this is like having infinite teeth, i.e. no backlash
        //my_freewheel->SetFreeBackward(); // this is to reverse the unidirectional behavior
        sys.Add(my_freewheel);

        // Make the clutch that keeps the shaft C in place:
        auto my_clutch = chrono_types::make_shared<ChShaftsClutch>();
        my_clutch->Initialize(my_shaftC, my_shaftD);
        my_clutch->SetTorqueLimit(100);
        sys.Add(my_clutch);


        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        ChStreamOutAsciiFile file_results("test_clutch.txt");

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        double step = 0.01;
        while (chronoTime < 5.5) {
            chronoTime += step;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoStepDynamics(step);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                << "  shaft B rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                << "  shaft C rot: " << my_shaftC->GetPos() << "  speed: " << my_shaftC->GetPos_dt()
                << "  accel: " << my_shaftC->GetPos_dtdt() << "\n"
                << "  Torque: Tmotor=" << my_motor->GetTorqueReactionOn1()
                << "  Tfreewheel=" << my_freewheel->GetTorqueReactionOn1()
                << "  Tclutch=" << my_clutch->GetTorqueReactionOn1()
                << "  ratchet vane=" << my_freewheel->GetCurrentTeethVane()
                << "\n";
            file_results << chronoTime << ", " 
                << my_shaftB->GetPos() << ", " 
                << my_shaftC->GetPos() << ", " 
                << my_shaftC->GetPos_dt() << ", " 
                << my_clutch->GetTorqueReactionOn1() << ", " 
                << my_freewheel->GetCurrentTeethVane() << "\n";
        }
    }

    return 0;
}